

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

int m_next_cds(aec_stream_conflict *strm)

{
  uint uVar1;
  internal_state_conflict *piVar2;
  byte *pbVar3;
  _func_int_aec_stream_ptr_conflict *UNRECOVERED_JUMPTABLE;
  uint32_t uVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  
  piVar2 = strm->state;
  if ((piVar2->offsets != (vector_t *)0x0) &&
     (piVar2->rsi_size == (long)piVar2->rsip - (long)piVar2->rsi_buffer >> 2)) {
    vector_push_back(piVar2->offsets,(strm->total_in - strm->avail_in) * 8 - (long)piVar2->bitp);
  }
  if (piVar2->rsi_size == (long)piVar2->rsip - (long)piVar2->rsi_buffer >> 2) {
    (*piVar2->flush_output)(strm);
    piVar2->flush_start = piVar2->rsi_buffer;
    piVar2->rsip = piVar2->rsi_buffer;
    if (piVar2->pp != 0) {
      piVar2->ref = 1;
      piVar2->encoded_block_size = strm->block_size - 1;
    }
    if ((strm->flags & 0x20) != 0) {
      uVar1 = piVar2->bitp;
      uVar7 = uVar1 + 7;
      if (-1 < (int)uVar1) {
        uVar7 = uVar1;
      }
      piVar2->bitp = uVar7 & 0xfffffff8;
    }
  }
  else {
    piVar2->ref = 0;
    piVar2->encoded_block_size = strm->block_size;
  }
  uVar6 = strm->avail_in;
  piVar2 = strm->state;
  iVar5 = piVar2->id_len;
  if (uVar6 < piVar2->in_blklen) {
    iVar8 = piVar2->bitp;
    while (iVar8 < iVar5) {
      uVar6 = uVar6 - 1;
      if (uVar6 == 0xffffffffffffffff) {
        piVar2->mode = m_id;
        return 0;
      }
      strm->avail_in = uVar6;
      uVar9 = piVar2->acc << 8;
      piVar2->acc = uVar9;
      pbVar3 = strm->next_in;
      strm->next_in = pbVar3 + 1;
      piVar2->acc = *pbVar3 | uVar9;
      iVar8 = iVar8 + 8;
      piVar2->bitp = iVar8;
    }
    iVar8 = piVar2->bitp - iVar5;
    piVar2->id = (uint)(piVar2->acc >> ((byte)iVar8 & 0x3f)) &
                 (uint)(0xffffffffffffffff >> (-(char)iVar5 & 0x3fU));
    piVar2->bitp = iVar8;
  }
  else {
    uVar4 = direct_get(strm,iVar5);
    piVar2->id = uVar4;
  }
  UNRECOVERED_JUMPTABLE = piVar2->id_table[piVar2->id];
  piVar2->mode = UNRECOVERED_JUMPTABLE;
  iVar5 = (*UNRECOVERED_JUMPTABLE)(strm);
  return iVar5;
}

Assistant:

static int m_next_cds(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    if ((state->offsets != NULL) && (state->rsi_size == RSI_USED_SIZE(state)))
        vector_push_back(
            state->offsets,
            strm->total_in * 8 - (strm->avail_in * 8 + state->bitp));

    if (state->rsi_size == RSI_USED_SIZE(state)) {
        state->flush_output(strm);
        state->flush_start = state->rsi_buffer;
        state->rsip = state->rsi_buffer;
        if (state->pp) {
            state->ref = 1;
            state->encoded_block_size = strm->block_size - 1;
        }
        if (strm->flags & AEC_PAD_RSI)
            state->bitp -= state->bitp % 8;
    } else {
        state->ref = 0;
        state->encoded_block_size = strm->block_size;
    }
    return m_id(strm);
}